

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formatter.h
# Opt level: O2

void StringFormatter<unsigned_long_&,_unsigned_long_&,_unsigned_long_&,_unsigned_long_&,_unsigned_long_&,_unsigned_long_&,_unsigned_long_&,_unsigned_char_&,_unsigned_short_&,_unsigned_int_&,_unsigned_long_&>
     ::format<unsigned_long>(ostream *os,char *fmt,unsigned_long *value)

{
  char cVar1;
  char cVar2;
  uint uVar3;
  char *pcVar4;
  char cVar5;
  long lVar6;
  long lVar7;
  void *pvVar8;
  runtime_error *this;
  char *__nptr;
  char *pcVar9;
  char *pcVar10;
  bool bVar11;
  ostream local_6a;
  long local_60;
  int local_40;
  char *q;
  
  do {
    cVar5 = *fmt;
    if (cVar5 == '%') {
      cVar1 = fmt[1];
      cVar5 = '%';
      lVar6 = 2;
      if (cVar1 != '%') {
        cVar5 = fmt[(ulong)(cVar1 == '-') + 1];
        lVar6 = (ulong)(cVar5 == ' ' || cVar5 == '+') + (ulong)(cVar1 == '-');
        __nptr = fmt + lVar6 + 1;
        if (*__nptr == ',') {
          __nptr = fmt + lVar6 + 2;
          local_6a = (ostream)0x2c;
        }
        else if (*__nptr == '0') {
          __nptr = fmt + lVar6 + 2;
          local_6a = (ostream)0x30;
        }
        else {
          local_6a = (ostream)0x20;
        }
        lVar6 = strtol(__nptr,&q,10);
        pcVar4 = q;
        if (*q == '.') {
          pcVar9 = q + 1;
          lVar7 = strtol(pcVar9,&q,10);
          bVar11 = pcVar9 != q;
          local_60 = (long)(int)lVar7;
        }
        else {
          local_60 = 0;
          bVar11 = false;
        }
        do {
          pcVar9 = q;
          cVar2 = *pcVar9;
          pvVar8 = memchr("qhlLzjt",(int)cVar2,8);
          q = pcVar9 + 1;
        } while (pvVar8 != (void *)0x0);
        pcVar10 = pcVar9;
        if ((cVar2 == 'I') && (pcVar10 = pcVar9 + 1, (byte)(pcVar9[2] | 2U) == 0x36)) {
          pcVar10 = pcVar9 + 3;
        }
        cVar2 = *pcVar10;
        applytype(os,cVar2);
        lVar7 = *(long *)os;
        if (cVar5 == '+') {
          os[*(long *)(lVar7 + -0x18) + 0x19] =
               (ostream)((byte)os[*(long *)(lVar7 + -0x18) + 0x19] | 8);
          if (cVar1 == '-') goto LAB_001133da;
          uVar3 = 0x10;
        }
        else {
          os[*(long *)(lVar7 + -0x18) + 0x19] =
               (ostream)((byte)os[*(long *)(lVar7 + -0x18) + 0x19] & 0xf7);
          if (cVar1 != '-') goto LAB_001133ef;
LAB_001133da:
          uVar3 = 0x20;
        }
        *(uint *)(os + *(long *)(lVar7 + -0x18) + 0x18) =
             *(uint *)(os + *(long *)(lVar7 + -0x18) + 0x18) & 0xffffff4f | uVar3;
LAB_001133ef:
        if (__nptr == pcVar4) {
          *(undefined8 *)(os + *(long *)(lVar7 + -0x18) + 0x10) = 0;
        }
        else {
          local_40 = (int)lVar6;
          *(long *)(os + *(long *)(lVar7 + -0x18) + 0x10) = (long)local_40;
          if (cVar1 != '-' && cVar5 != '+') {
            *(uint *)(os + *(long *)(lVar7 + -0x18) + 0x18) =
                 *(uint *)(os + *(long *)(lVar7 + -0x18) + 0x18) & 0xffffff4f | 0x80;
          }
        }
        if (bVar11) {
          *(long *)(os + *(long *)(lVar7 + -0x18) + 8) = local_60;
        }
        lVar6 = *(long *)(lVar7 + -0x18);
        std::ios::fill();
        os[lVar6 + 0xe0] = local_6a;
        if ((cVar2 != 'c') || (bVar11 = output_wchar<unsigned_long>(os,value), !bVar11)) {
          pvVar8 = memchr("iduoxX",(int)cVar2,7);
          if (pvVar8 == (void *)0x0) {
            bVar11 = output_using_operator<unsigned_long>(os,value);
            if (!bVar11) {
              std::operator<<(os,"<?>");
            }
          }
          else {
            std::ostream::_M_insert<unsigned_long>((ulong)os);
          }
        }
        *(undefined8 *)(os + *(long *)(*(long *)os + -0x18) + 8) = 0;
        format(os,pcVar10 + (cVar2 != '\0'));
        return;
      }
    }
    else {
      lVar6 = 1;
      if (cVar5 == '\0') {
        this = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this,"too many arguments for format");
        __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
    }
    fmt = fmt + lVar6;
    std::operator<<(os,cVar5);
  } while( true );
}

Assistant:

static void format(std::ostream& os, const char *fmt, T& value, FARGS&&...args) 
    {
        bool used_value = false;
        const char *p= fmt;
        while (*p) {
            if (*p=='%') {
                p++;
                if (*p=='%') {
                    os << *p++;
                }
                else {

                    // '-'  means left adjust
                    bool leftadjust= false;
                    if (*p=='-') {
                        p++;
                        leftadjust= true;
                    }
                    bool forcesign= false;
                    //bool blankforpositive= false;
                    if (*p=='+') {
                        p++;
                        forcesign= true;
                    }
                    else if (*p==' ') {
                        p++;
                        //blankforpositive= true;  // <-- todo
                    }
                    
                    // '0' means pad with zero
                    // ',' is useful for arrays
                    char padchar= ' ';

                    if (*p=='0') { p++; padchar='0'; }
                    else if (*p==',') { p++; padchar=','; }

                    // width specification
                    char *q;
                    // todo: support '*'  : take size from argumentlist.
                    // todo: support '#'  : adds 0, 0x, 0X prefix to oct/hex numbers -> 'showbase'
                    int width= strtol(p, &q, 10);
                    bool havewidth= p!=q;
                    p= q;

                    // precision after '.'
                    int precision= 0;
                    bool haveprecision= false;
                    if (*p=='.') {
                        p++;
                        // todo: support '*'
                        precision= strtol(p, &q, 10);
                        haveprecision= p!=q;
                        p= q;
                    }

                    // ignore argument size field
                    while (std::strchr("qhlLzjt", *p))
                        p++;
                    if (*p=='I') {
                        // microsoft I64 specifier
                        p++;
                        if (p[1]=='6' || p[1]=='4') {
                            p+=2;
                        }
                    }

                    char type= 0;
                    if (*p)
                        type= *p++;

                    // use formatting
                    applytype(os, type);
                    if (forcesign)
                        os << std::showpos;
                    else
                        os << std::noshowpos;

                    if (leftadjust)
                        os << std::left;
                    else if (forcesign) {
                        // exception: when forcing display of sign
                        // we need to use 'internal fill'
                        os << std::internal;
                    }

                    if (havewidth) {
                        os.width(width);
                        if (!leftadjust && !forcesign)
                            os << std::right;
                    }
                    else {
                        os.width(0);
                    }
                    // todo: support precision(truncate) for strings
                    if (haveprecision)
                        os.precision(precision);
                    os.fill(padchar);

                    if (type=='c' && output_wchar(os, value))
                    {
                        // nop
                    }
                    else if (type=='p' && output_pointer(os, value))
                    {
                        // nop
                    }
                    else if (type=='b' && output_hex_data(os, value))
                    {
                        // nop
                    }
                    else if (std::strchr("iduoxX", type) && output_int(os, value))
                    {
                        // nop
                    }
                    else if (type=='s' && output_null(os, value))
                    {
                        // nop
                    }
                    else if (output_using_operator(os, value))
                    {
                        // when type ~ float/double : '[AEFGaefg]' || type == 's' || other outputs failed.
                        // nop
                    }
                    else {
                        os << "<?>";
                    }

                    // TODO: improve float formatting

                    // reset precision
                    os.precision(0);

                    used_value = true;

                    format(os, p, args...);
                    return;
                }
            }
            else {
                os << *p++;
            }
        }

        if (!used_value)
            throw std::runtime_error("too many arguments for format");
    }